

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Error_target_asset_not_contains_utxos_Test::
CoinSelection_SelectCoins_Error_target_asset_not_contains_utxos_Test
          (CoinSelection_SelectCoins_Error_target_asset_not_contains_utxos_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002a3d68;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_target_asset_not_contains_utxos) {
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 100000000;
  map_target_amount["0000000000000000000000000000000000000000000000000000000000000000"] = 1000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  std::vector<Utxo> tmp;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, tmp, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb), CfdException);
}